

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O3

void mtbdd_test_isset(MTBDD set)

{
  int iVar1;
  long lVar2;
  
  while( true ) {
    if (set == 0) {
      __assert_fail("set != mtbdd_false",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_mtbdd.c"
                    ,0xddf,"void mtbdd_test_isset(MTBDD)");
    }
    iVar1 = llmsset_is_marked(nodes,set);
    if (iVar1 == 0) break;
    lVar2 = (set & 0xffffffffff) * 0x10;
    if ((set & 0x8000000000000000) != 0 || (*(ulong *)(nodes->data + lVar2 + 8) & 0xffffffffff) != 0
       ) {
      __assert_fail("node_getlow(set, n) == mtbdd_false",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_mtbdd.c"
                    ,0xde2,"void mtbdd_test_isset(MTBDD)");
    }
    set = *(ulong *)(nodes->data + lVar2) & 0x800000ffffffffff;
  }
  __assert_fail("llmsset_is_marked(nodes, set)",
                "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_mtbdd.c"
                ,0xde0,"void mtbdd_test_isset(MTBDD)");
}

Assistant:

void
mtbdd_test_isset(MTBDD set)
{
    while (set != mtbdd_true) {
        assert(set != mtbdd_false);
        assert(llmsset_is_marked(nodes, set));
        mtbddnode_t n = MTBDD_GETNODE(set);
        assert(node_getlow(set, n) == mtbdd_false);
        set = node_gethigh(set, n);
    }
}